

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_contains(roaring_bitmap_t *r,uint32_t val)

{
  uint uVar1;
  undefined8 in_RAX;
  array_container_t *arr;
  _Bool _Var2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  uVar1 = ra_get_index(&r->high_low_container,(uint16_t)(val >> 0x10));
  if ((int)uVar1 < 0) {
    _Var2 = false;
  }
  else {
    uStack_18._7_1_ = (r->high_low_container).typecodes[uVar1 & 0xffff];
    arr = (array_container_t *)
          container_unwrap_shared
                    ((r->high_low_container).containers[uVar1 & 0xffff],
                     (uint8_t *)((long)&uStack_18 + 7));
    if (uStack_18._7_1_ == '\x03') {
      _Var2 = run_container_contains((run_container_t *)arr,(uint16_t)val);
    }
    else if (uStack_18._7_1_ == '\x02') {
      _Var2 = array_container_contains(arr,(uint16_t)val);
    }
    else {
      if (uStack_18._7_1_ != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x124d,"_Bool container_contains(const container_t *, uint16_t, uint8_t)");
      }
      _Var2 = (*(ulong *)((long)arr->array + (ulong)(val >> 3 & 0x1ff8)) >> ((ulong)val & 0x3f) & 1)
              != 0;
    }
  }
  return _Var2;
}

Assistant:

bool roaring_bitmap_contains(const roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    /*
     * the next function call involves a binary search and lots of branching.
     */
    int32_t i = ra_get_index(&r->high_low_container, hb);
    if (i < 0) return false;

    uint8_t typecode;
    // next call ought to be cheap
    container_t *container =
        ra_get_container_at_index(&r->high_low_container, i, &typecode);
    // rest might be a tad expensive, possibly involving another round of binary search
    return container_contains(container, val & 0xFFFF, typecode);
}